

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# numeric.cpp
# Opt level: O2

void __thiscall
clickhouse::ColumnVector<unsigned_long>::ColumnVector
          (ColumnVector<unsigned_long> *this,
          vector<unsigned_long,_std::allocator<unsigned_long>_> *data)

{
  TypeRef TStack_28;
  
  Type::CreateSimple<unsigned_long>();
  Column::Column(&this->super_Column,&TStack_28);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&TStack_28.super___shared_ptr<clickhouse::Type,_(__gnu_cxx::_Lock_policy)2>._M_refcount
            );
  (this->super_Column)._vptr_Column = (_func_int **)&PTR__ColumnVector_001865b8;
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector(&this->data_,data);
  return;
}

Assistant:

ColumnVector<T>::ColumnVector(const std::vector<T>& data)
    : Column(Type::CreateSimple<T>())
    , data_(data)
{
}